

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O1

void UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UChar UVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int32_t *piVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  undefined4 *puVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  UBool useFallback;
  int iVar19;
  char *pcVar20;
  char *pcVar21;
  UChar *pUVar22;
  char cVar23;
  ulong uVar24;
  UChar *pUVar25;
  UChar32 cp;
  ulong uVar26;
  UConverter *cnv;
  bool bVar27;
  byte bStack_cc;
  undefined1 local_cb;
  undefined2 uStack_ca;
  char buffer [8];
  uint32_t value;
  undefined4 uStack_bc;
  int32_t *offsets;
  uint local_ac;
  uint32_t local_a8;
  int local_a4;
  UConverterFromUnicodeArgs *local_a0;
  UConverter *local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  char *local_78;
  ulong local_70;
  UChar *local_68;
  UChar *local_60;
  ulong local_58;
  undefined4 *local_50;
  UErrorCode *local_48;
  char *local_40;
  ulong local_38;
  
  cnv = args->converter;
  pUVar25 = args->source;
  pcVar20 = args->target;
  pUVar22 = args->sourceLimit;
  local_a0 = args;
  offsets = args->offsets;
  pvVar3 = cnv->extraInfo;
  puVar14 = (undefined4 *)((long)pvVar3 + 0x62);
  uVar9 = cnv->fromUChar32;
  local_78 = args->targetLimit;
  uVar13 = 0;
  uVar15 = 0;
  local_a8 = 0;
  local_48 = err;
  local_98 = cnv;
  local_60 = pUVar22;
  local_50 = puVar14;
  pcVar21 = pcVar20;
  if (uVar9 != 0 && pcVar20 < args->targetLimit) goto LAB_001b6ade;
LAB_001b6aa7:
  do {
    if (pUVar22 <= pUVar25) goto LAB_001b71c6;
    if (local_78 <= pcVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_001b71c6;
    }
    UVar2 = *pUVar25;
    uVar26 = (ulong)(ushort)UVar2;
    uVar9 = (uint)(ushort)UVar2;
    pUVar25 = pUVar25 + 1;
    pcVar21 = pcVar20;
    if ((UVar2 & 0xf800U) == 0xd800) {
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_001b6ade:
        if (pUVar25 < pUVar22) {
          UVar2 = *pUVar25;
          uVar7 = UVar2 & 0xfc00;
          if (uVar7 == 0xdc00) {
            pUVar25 = pUVar25 + 1;
            uVar9 = (uint)(ushort)UVar2 + uVar9 * 0x400 + 0xfca02400;
            uVar8 = 0;
          }
          else {
            *err = U_ILLEGAL_CHAR_FOUND;
            uVar8 = uVar9;
          }
          cnv->fromUChar32 = uVar8;
          uVar26 = (ulong)uVar9;
          pcVar20 = pcVar21;
          if (uVar7 == 0xdc00) goto LAB_001b6b2b;
          goto LAB_001b71c6;
        }
      }
      else {
LAB_001b71bc:
        uVar9 = (uint)uVar26;
        *err = U_ILLEGAL_CHAR_FOUND;
      }
      cnv->fromUChar32 = uVar9;
      pcVar20 = pcVar21;
      goto LAB_001b71c6;
    }
LAB_001b6b2b:
    uVar9 = (uint)uVar26;
    if ((int)uVar9 < 0x80) {
      if (((int)uVar9 < 0x20) && ((0x800c000U >> (uVar9 & 0x1f) & 1) != 0)) goto LAB_001b71bc;
      if (*(char *)((long)pvVar3 + 0x66) == '\0') {
        buffer[0] = (char)uVar26;
        iVar19 = 1;
      }
      else {
        buffer[1] = (char)uVar26;
        buffer[0] = '\x0f';
        *(undefined1 *)((long)pvVar3 + 0x66) = 0;
        iVar19 = 2;
        uVar13 = 0;
        uVar15 = 0;
      }
      if ((uVar9 == 0xd) || (uVar9 == 10)) {
        *(undefined2 *)(puVar14 + 1) = 0;
        *puVar14 = 0;
        uVar15 = 0;
        uVar13 = uVar15;
      }
    }
    else {
      if (uVar15 == 0) {
        bVar1 = *(byte *)((long)pvVar3 + 99);
        cVar12 = bVar1 + (bVar1 == 0);
        if (*(int *)((long)pvVar3 + 0x6c) == 1) {
          if (cVar12 == '\x02') {
            _local_cb = 0x210102;
          }
          else if (cVar12 == '\x01') {
            _local_cb = 0x22101;
          }
          else {
            _local_cb = CONCAT21(0x201,cVar12);
          }
          uVar13 = 3;
          uVar15 = 3;
        }
        else if (*(int *)((long)pvVar3 + 0x6c) == 0) {
          if (bVar1 < 2) {
            _local_cb = CONCAT11(0x21,cVar12);
          }
          else {
            _local_cb = CONCAT11(1,cVar12);
          }
          uVar13 = 2;
          uVar15 = 2;
        }
        else {
          _local_cb = CONCAT12(uStack_ca._1_1_,0x121);
          uVar15 = 0;
          uVar13 = 0;
        }
      }
      bVar27 = true;
      if ((int)uVar15 < 1) {
        iVar19 = 0;
        uVar24 = 0;
      }
      else {
        local_40 = pcVar21;
        local_68 = pUVar25;
        useFallback = cnv->useFallback;
        uVar24 = uVar26 >> 10;
        local_7c = (uint)(uVar26 >> 4) & 0x3f;
        uVar13 = uVar9 & 0xf;
        local_80 = 0x10000 << (sbyte)uVar13;
        local_88 = uVar9 - 0xe000;
        local_8c = uVar9 - 0xf0000;
        local_ac = uVar15;
        uVar18 = (ulong)uVar15;
        uVar16 = 1;
        uVar15 = 0;
        local_a4 = 0;
        uVar9 = 0;
        local_58 = uVar24;
        local_84 = uVar13;
        local_70 = uVar18;
        local_38 = uVar26;
        do {
          bVar1 = (&bStack_cc)[uVar16];
          if (0 < (long)(char)bVar1) {
            cp = (UChar32)uVar26;
            if (bVar1 < 0x20) {
              lVar17 = *(long *)((long)pvVar3 + (long)(char)bVar1 * 8);
              if ((cp < 0x10000) || ((*(byte *)(lVar17 + 0xfd) & 1) != 0)) {
                uVar8 = *(uint *)(*(long *)(lVar17 + 0x58) +
                                 (ulong)(*(ushort *)(*(long *)(lVar17 + 0x58) + uVar24 * 2) +
                                        local_7c) * 4);
                uVar7 = *(ushort *)
                         (*(long *)(lVar17 + 0xe8) + (ulong)((uVar8 & 0xffff) << 4 | uVar13) * 2);
                if ((local_80 & uVar8) == 0) {
                  if ((((useFallback == '\0') && (0x18ff < local_88)) && (0x1ffff < local_8c)) ||
                     (uVar7 == 0)) goto LAB_001b6cc2;
                  uVar8 = uVar7 < 0x100 | 0xfffffffe;
                }
                else {
                  uVar8 = 2 - (uVar7 < 0x100);
                }
                _value = (char *)CONCAT44(uStack_bc,(uint)uVar7);
              }
              else {
LAB_001b6cc2:
                if (*(int32_t **)(lVar17 + 0x120) == (int32_t *)0x0) {
                  uVar8 = 0;
                }
                else {
                  uVar8 = ucnv_extSimpleMatchFromU_63
                                    (*(int32_t **)(lVar17 + 0x120),cp,&value,useFallback);
                  uVar18 = local_70;
                  uVar24 = local_58;
                  uVar26 = local_38;
                  uVar13 = local_84;
                }
              }
              if ((uVar8 == 2) || ((uVar8 == 0xfffffffe && (uVar9 == 0)))) {
                uVar15 = 1;
                local_a8 = value;
                useFallback = '\0';
                local_a4 = (int)(char)bVar1;
                uVar9 = uVar8;
              }
            }
            else {
              lVar17 = *(long *)((long)pvVar3 + 0x18);
              if ((cp < 0x10000) || ((*(byte *)(lVar17 + 0xfd) & 1) != 0)) {
                lVar4 = *(long *)(lVar17 + 0xe8);
                uVar8 = *(uint *)(*(long *)(lVar17 + 0x58) +
                                 (ulong)(*(ushort *)(*(long *)(lVar17 + 0x58) + uVar24 * 2) +
                                        local_7c) * 4);
                lVar5 = (ulong)((uVar8 & 0xffff) << 4 | uVar13) * 3;
                uVar11 = (uint)*(byte *)(lVar4 + 1 + lVar5) << 8 |
                         (uint)*(byte *)(lVar4 + lVar5) << 0x10;
                iVar19 = 1;
                if (uVar11 != 0) {
                  iVar19 = 3 - (uint)(*(byte *)(lVar4 + lVar5) == 0);
                }
                uVar11 = uVar11 | *(byte *)(lVar4 + 2 + lVar5);
                uVar18 = local_70;
                if ((local_80 & uVar8) == 0) {
                  if ((((useFallback == '\0') && (0x18ff < local_88)) && (0x1ffff < local_8c)) ||
                     (uVar11 == 0)) goto LAB_001b6d8f;
                  _value = (char *)CONCAT44(uStack_bc,uVar11);
                  iVar19 = -iVar19;
                }
                else {
                  _value = (char *)CONCAT44(uStack_bc,uVar11);
                }
              }
              else {
LAB_001b6d8f:
                if (*(int32_t **)(lVar17 + 0x120) == (int32_t *)0x0) {
                  iVar19 = 0;
                }
                else {
                  iVar19 = ucnv_extSimpleMatchFromU_63
                                     (*(int32_t **)(lVar17 + 0x120),cp,&value,useFallback);
                  uVar18 = local_70;
                  uVar24 = local_58;
                  uVar13 = local_84;
                }
              }
              if ((iVar19 == 3) || ((iVar19 == -3 && (uVar9 == 0)))) {
                if (-1 >= iVar19) {
                  useFallback = '\0';
                }
                local_a8 = value;
                local_a4 = (value >> 0x10) - 0x60;
                uVar9 = (uint)(-1 < iVar19) * 4 - 2;
                if ((char)((ulong)_value >> 0x10) == -0x7f) {
                  uVar15 = 1;
                }
                else if ((value >> 0x10 & 0xff) == 0x82) {
                  uVar15 = 2;
                }
                else if (*(int *)((long)pvVar3 + 0x6c) == 1) {
                  uVar15 = 3;
                }
                else {
                  uVar9 = 0;
                }
              }
            }
          }
        } while ((uVar16 < uVar18) && (uVar16 = uVar16 + 1, (int)uVar9 < 1));
        uVar24 = (ulong)uVar15;
        bVar27 = uVar9 == 0;
        err = local_48;
        pcVar21 = local_40;
        pUVar22 = local_60;
        pUVar25 = local_68;
        cnv = local_98;
        puVar14 = local_50;
        uVar15 = local_ac;
        uVar13 = local_ac;
        iVar19 = local_a4;
      }
      if (bVar27) {
        *err = U_INVALID_CHAR_FOUND;
        cnv->fromUChar32 = (UChar32)uVar26;
        iVar19 = 0;
      }
      else {
        cVar23 = (char)uVar24;
        uVar9 = 0;
        cVar12 = (char)iVar19;
        if (cVar12 != *(char *)((long)puVar14 + uVar24)) {
          lVar17 = (long)cVar12 + -0x1e;
          if (cVar12 < '\x03') {
            lVar17 = (long)cVar12;
          }
          buffer._0_4_ = *(undefined4 *)
                          (_ZL13escSeqCharsCN_rel + *(int *)(_ZL13escSeqCharsCN_rel + lVar17 * 4));
          *(char *)((long)puVar14 + uVar24) = cVar12;
          uVar15 = uVar13;
          if (cVar23 == '\x01') {
            uVar15 = 0;
          }
          uVar9 = 4;
          uVar13 = uVar15;
        }
        if (cVar23 != *(char *)((long)pvVar3 + 0x66)) {
          uVar18 = (ulong)uVar9;
          uVar16 = uVar18 | 1;
          if (cVar23 == '\x02') {
            buffer[uVar18] = '\x1b';
            uVar9 = uVar9 | 2;
            buffer[uVar16] = 'N';
          }
          else if ((int)uVar24 == 1) {
            buffer[uVar18] = '\x0e';
            *(undefined1 *)((long)pvVar3 + 0x66) = 1;
            uVar9 = (uint)uVar16;
          }
          else {
            buffer[uVar18] = '\x1b';
            uVar9 = uVar9 | 2;
            buffer[uVar16] = 'O';
          }
        }
        cnv = local_98;
        iVar19 = uVar9 + 2;
        *(ushort *)(buffer + uVar9) = (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
      }
      pcVar20 = pcVar21;
      if (bVar27) goto LAB_001b71c6;
    }
    piVar6 = offsets;
    if (iVar19 == 2) {
      pcVar20 = pcVar21 + 2;
      if (pcVar20 <= local_78) {
        *pcVar21 = buffer[0];
        pcVar21[1] = buffer[1];
        if (offsets != (int32_t *)0x0) {
          iVar19 = -1;
          if (0xffff < (uint)uVar26) {
            iVar19 = -2;
          }
          iVar19 = (int)((ulong)((long)pUVar25 - (long)local_a0->source) >> 1) + iVar19;
          *offsets = iVar19;
          offsets = offsets + 2;
          piVar6[1] = iVar19;
        }
        goto LAB_001b6aa7;
      }
    }
    else if (iVar19 == 1) {
      *pcVar21 = buffer[0];
      pcVar20 = pcVar21 + 1;
      if (offsets != (int32_t *)0x0) {
        offsets = offsets + 1;
        *piVar6 = (int)((ulong)((long)pUVar25 - (long)local_a0->source) >> 1) + -1;
      }
      goto LAB_001b6aa7;
    }
    iVar10 = -1;
    if (0xffff < (uint)uVar26) {
      iVar10 = -2;
    }
    _value = pcVar21;
    local_ac = uVar15;
    local_68 = pUVar25;
    ucnv_fromUWriteBytes_63
              (cnv,buffer,iVar19,(char **)&value,local_78,&offsets,
               (int)((ulong)((long)pUVar25 - (long)local_a0->source) >> 1) + iVar10,err);
    pcVar20 = _value;
    pUVar22 = local_60;
    pUVar25 = local_68;
    uVar15 = local_ac;
    uVar13 = local_ac;
    if (U_ZERO_ERROR < *err) {
LAB_001b71c6:
      _value = pcVar20;
      if ((((*err < U_ILLEGAL_ARGUMENT_ERROR) && (*(char *)((long)pvVar3 + 0x66) != '\0')) &&
          (local_a0->flush != '\0')) && ((pUVar22 <= pUVar25 && (cnv->fromUChar32 == 0)))) {
        *(undefined1 *)((long)pvVar3 + 0x66) = 0;
        pUVar22 = local_a0->source;
        iVar19 = (int)((ulong)((long)pUVar25 - (long)pUVar22) >> 1);
        if (iVar19 < 1) {
          uVar9 = 0xffffffff;
        }
        else {
          uVar9 = iVar19 - 1;
          if (((pUVar22[uVar9] & 0xfc00U) == 0xdc00) &&
             ((uVar9 == 0 || ((pUVar22[iVar19 - 2] & 0xfc00U) == 0xd800)))) {
            uVar9 = iVar19 - 2;
          }
        }
        ucnv_fromUWriteBytes_63(cnv,"\x0f",1,(char **)&value,local_78,&offsets,uVar9,err);
      }
      local_a0->source = pUVar25;
      local_a0->target = _value;
      return;
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len;
    int8_t choices[3];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do the conversion */
            if(sourceChar <= 0x007f ){
                /* do not convert SO/SI/ESC */
                if(IS_2022_CONTROL(sourceChar)) {
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }

                /* US-ASCII */
                if(pFromU2022State->g == 0) {
                    buffer[0] = (char)sourceChar;
                    len = 1;
                } else {
                    buffer[0] = UCNV_SI;
                    buffer[1] = (char)sourceChar;
                    len = 2;
                    pFromU2022State->g = 0;
                    choiceCount = 0;
                }
                if(sourceChar == CR || sourceChar == LF) {
                    /* reset the state at the end of a line */
                    uprv_memset(pFromU2022State, 0, sizeof(ISO2022State));
                    choiceCount = 0;
                }
            }
            else{
                /* convert U+0080..U+10ffff */
                int32_t i;
                int8_t cs, g;

                if(choiceCount == 0) {
                    /* try the current SO/G1 converter first */
                    choices[0] = pFromU2022State->cs[1];

                    /* default to GB2312_1 if none is designated yet */
                    if(choices[0] == 0) {
                        choices[0] = GB2312_1;
                    }

                    if(converterData->version == 0) {
                        /* ISO-2022-CN */

                        /* try the other SO/G1 converter; a CNS_11643_1 lookup may result in any plane */
                        if(choices[0] == GB2312_1) {
                            choices[1] = (int8_t)CNS_11643_1;
                        } else {
                            choices[1] = (int8_t)GB2312_1;
                        }

                        choiceCount = 2;
                    } else if (converterData->version == 1) {
                        /* ISO-2022-CN-EXT */

                        /* try one of the other converters */
                        switch(choices[0]) {
                        case GB2312_1:
                            choices[1] = (int8_t)CNS_11643_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        case ISO_IR_165:
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)CNS_11643_1;
                            break;
                        default: /* CNS_11643_x */
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        }

                        choiceCount = 3;
                    } else {
                        choices[0] = (int8_t)CNS_11643_1;
                        choices[1] = (int8_t)GB2312_1;
                    }
                }

                cs = g = 0;
                /*
                 * len==0: no mapping found yet
                 * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
                 * len>0: found a roundtrip result, done
                 */
                len = 0;
                /*
                 * We will turn off useFallback after finding a fallback,
                 * but we still get fallbacks from PUA code points as usual.
                 * Therefore, we will also need to check that we don't overwrite
                 * an early fallback with a later one.
                 */
                useFallback = cnv->useFallback;

                for(i = 0; i < choiceCount && len <= 0; ++i) {
                    int8_t cs0 = choices[i];
                    if(cs0 > 0) {
                        uint32_t value;
                        int32_t len2;
                        if(cs0 >= CNS_11643_0) {
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[CNS_11643],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_3);
                            if(len2 == 3 || (len2 == -3 && len == 0)) {
                                targetValue = value;
                                cs = (int8_t)(CNS_11643_0 + (value >> 16) - 0x80);
                                if(len2 >= 0) {
                                    len = 2;
                                } else {
                                    len = -2;
                                    useFallback = FALSE;
                                }
                                if(cs == CNS_11643_1) {
                                    g = 1;
                                } else if(cs == CNS_11643_2) {
                                    g = 2;
                                } else /* plane 3..7 */ if(converterData->version == 1) {
                                    g = 3;
                                } else {
                                    /* ISO-2022-CN (without -EXT) does not support plane 3..7 */
                                    len = 0;
                                }
                            }
                        } else {
                            /* GB2312_1 or ISO-IR-165 */
                            U_ASSERT(cs0<UCNV_2022_MAX_CONVERTERS);
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[cs0],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_2);
                            if(len2 == 2 || (len2 == -2 && len == 0)) {
                                targetValue = value;
                                len = len2;
                                cs = cs0;
                                g = 1;
                                useFallback = FALSE;
                            }
                        }
                    }
                }

                if(len != 0) {
                    len = 0; /* count output bytes; it must have been abs(len) == 2 */

                    /* write the designation sequence if necessary */
                    if(cs != pFromU2022State->cs[g]) {
                        if(cs < CNS_11643) {
                            uprv_memcpy(buffer, escSeqCharsCN[cs], 4);
                        } else {
                            U_ASSERT(cs >= CNS_11643_1);
                            uprv_memcpy(buffer, escSeqCharsCN[CNS_11643 + (cs - CNS_11643_1)], 4);
                        }
                        len = 4;
                        pFromU2022State->cs[g] = cs;
                        if(g == 1) {
                            /* changing the SO/G1 charset invalidates the choices[] */
                            choiceCount = 0;
                        }
                    }

                    /* write the shift sequence if necessary */
                    if(g != pFromU2022State->g) {
                        switch(g) {
                        case 1:
                            buffer[len++] = UCNV_SO;

                            /* set the new state only if it is the locking shift SO/G1, not for SS2 or SS3 */
                            pFromU2022State->g = 1;
                            break;
                        case 2:
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4e;
                            break;
                        default: /* case 3 */
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4f;
                            break;
                        }
                    }

                    /* write the two output bytes */
                    buffer[len++] = (char)(targetValue >> 8);
                    buffer[len++] = (char)targetValue;
                } else {
                    /* if we cannot find the character after checking all codepages
                     * then this is an error
                     */
                    *err = U_INVALID_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* output len>0 bytes in buffer[] */
            if(len == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(len == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, len,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-CN conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        pFromU2022State->g!=0 &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        pFromU2022State->g=0;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}